

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::operator=(Mat *this,Mat *rhs)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  int *in_RDX;
  double *extraout_RDX;
  uint uVar5;
  ulong uVar6;
  Mat MVar7;
  
  if (rhs->v_ != (double *)0x0) {
    operator_delete(rhs->v_,8);
  }
  iVar1 = *in_RDX;
  rhs->n_rows_ = iVar1;
  iVar2 = in_RDX[1];
  rhs->n_cols_ = iVar2;
  uVar5 = iVar2 * iVar1;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (int)uVar5) {
    uVar6 = (long)(int)uVar5 * 8;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  rhs->v_ = pdVar4;
  if (0 < (int)uVar5) {
    lVar3 = *(long *)(in_RDX + 2);
    uVar6 = 0;
    do {
      pdVar4[uVar6] = *(double *)(lVar3 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  Mat(this,rhs);
  MVar7.v_ = extraout_RDX;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Mat Mat::operator=(const Mat& rhs)
{
	delete v_;	
	n_rows_ = rhs.n_rows_;
	n_cols_=rhs.n_cols_;
	int nEl = n_rows_*n_cols_;
	v_ = new double [nEl];
	for (int i=0; i<nEl; i++)
		v_[i]=rhs.v_[i];
	return *this;
}